

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O0

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Double_Test::Body
          (iu_SyntaxTest_x_iutest_x_Double_Test *this)

{
  bool bVar1;
  Fixed *pFVar2;
  char *pcVar3;
  AssertionHelper local_7c8;
  Fixed local_798;
  undefined1 local_610 [8];
  AssertionResult iutest_ar_3;
  double d_3;
  Fixed local_5b0;
  undefined1 local_428 [8];
  AssertionResult iutest_ar_2;
  double d_2;
  Fixed local_3c8;
  undefined1 local_240 [8];
  AssertionResult iutest_ar_1;
  double d_1;
  AssertionHelper local_208;
  Fixed local_1d8;
  undefined1 local_40 [8];
  AssertionResult iutest_ar;
  double d;
  iu_SyntaxTest_x_iutest_x_Double_Test *this_local;
  
  iutest_ar.m_result = false;
  iutest_ar._33_7_ = 0x3ff00000000000;
  iutest::detail::AlwaysZero();
  iutest::internal::CmpHelperFloatingPointEQ<double>
            ((AssertionResult *)local_40,"1.0","d",1.0,(double)iutest_ar._32_8_);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_1d8,(double)iutest_ar._32_8_);
    pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
               ,0xef,pcVar3,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_208,pFVar2);
    iutest::AssertionHelper::~AssertionHelper(&local_208);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (bVar1) {
    iutest_ar_1.m_result = false;
    iutest_ar_1._33_7_ = 0x3ff00000000000;
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperFloatingPointEQ<double>
              ((AssertionResult *)local_240,"1.0","d",1.0,(double)iutest_ar_1._32_8_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      memset(&local_3c8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3c8);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_3c8,(double)iutest_ar_1._32_8_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_240);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&d_2,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0xf1,pcVar3,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&d_2,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&d_2);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3c8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    iutest_ar_2.m_result = false;
    iutest_ar_2._33_7_ = 0x3ff00000000000;
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperFloatingPointEQ<double>
              ((AssertionResult *)local_428,"1.0","d",1.0,(double)iutest_ar_2._32_8_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
    if (!bVar1) {
      memset(&local_5b0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_5b0);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_5b0,(double)iutest_ar_2._32_8_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_428);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&d_3,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0xf3,pcVar3,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&d_3,pFVar2);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&d_3);
      iutest::AssertionHelper::Fixed::~Fixed(&local_5b0);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_428);
    iutest_ar_3.m_result = false;
    iutest_ar_3._33_7_ = 0x3ff00000000000;
    iutest::detail::AlwaysZero();
    iutest::internal::CmpHelperFloatingPointEQ<double>
              ((AssertionResult *)local_610,"1.0","d",1.0,(double)iutest_ar_3._32_8_);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
    if (!bVar1) {
      memset(&local_798,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_798);
      pFVar2 = iutest::AssertionHelper::Fixed::operator<<(&local_798,(double)iutest_ar_3._32_8_);
      pcVar3 = iutest::AssertionResult::message((AssertionResult *)local_610);
      iutest::AssertionHelper::AssertionHelper
                (&local_7c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
                 ,0xf5,pcVar3,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7c8,pFVar2);
      iutest::AssertionHelper::~AssertionHelper(&local_7c8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_798);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_610);
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, Double)
{
    if( double d = 1.0 )
        IUTEST_ASSERT_DOUBLE_EQ(1.0, d) << d;
    if( double d = 1.0 )
        IUTEST_EXPECT_DOUBLE_EQ(1.0, d) << d;
    if( double d = 1.0 )
        IUTEST_INFORM_DOUBLE_EQ(1.0, d) << d;
    if( double d = 1.0 )
        IUTEST_ASSUME_DOUBLE_EQ(1.0, d) << d;
}